

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

TValueCC calcCC<stSampleMulti<short,4>>
                   (TWaveformViewT<TSampleMI16> *waveform0,TWaveformViewT<TSampleMI16> *waveform1,
                   int64_t sum0,int64_t sum02)

{
  short sVar1;
  int iVar2;
  long *plVar3;
  const_reference pvVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  double dVar6;
  double dVar7;
  double den2b;
  double den2a;
  double nom;
  int32_t a1;
  int32_t a0;
  int j;
  int64_t is;
  long n;
  int64_t n1;
  stSampleMulti<short,_4> *samples1;
  int64_t n0;
  stSampleMulti<short,_4> *samples0;
  int64_t sum01;
  int64_t sum12;
  int64_t sum1;
  TValueCC cc;
  size_type in_stack_ffffffffffffff58;
  array<short,_4UL> *in_stack_ffffffffffffff60;
  int local_74;
  long local_70;
  long local_60;
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  
  local_28 = 0xbff0000000000000;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = *in_RDI;
  local_50 = in_RDI[1];
  local_58 = *in_RSI;
  local_60 = in_RSI[1];
  local_20 = in_RCX;
  local_18 = in_RDX;
  plVar3 = std::min<long>(&local_50,&local_60);
  lVar5 = *plVar3;
  for (local_70 = 0; local_70 < lVar5; local_70 = local_70 + 1) {
    for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
      pvVar4 = std::array<short,_4UL>::operator[]
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      sVar1 = *pvVar4;
      pvVar4 = std::array<short,_4UL>::operator[]
                         (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      iVar2 = (int)*pvVar4;
      local_30 = iVar2 + local_30;
      local_38 = iVar2 * iVar2 + local_38;
      local_40 = sVar1 * iVar2 + local_40;
    }
  }
  lVar5 = lVar5 * 4;
  dVar6 = (double)(local_40 * lVar5 - local_18 * local_30);
  dVar7 = sqrt((double)(local_20 * lVar5 - local_18 * local_18) *
               (double)(local_38 * lVar5 - local_30 * local_30));
  return dVar6 / dVar7;
}

Assistant:

TValueCC calcCC(
    const TWaveformViewT<TSampleMI16> & waveform0,
    const TWaveformViewT<TSampleMI16> & waveform1,
    int64_t sum0, int64_t sum02) {
    TValueCC cc = -1.0f;

    int64_t sum1 = 0;
    int64_t sum12 = 0;
    int64_t sum01 = 0;

    auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;
    auto n1       = waveform1.n;

#ifdef MY_DEBUG
    if (n0 != n1) {
        printf("BUG 234f8273\n");
    }
#endif
    auto n = std::min(n0, n1);

    for (int64_t is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples0[is][j];
            int32_t a1 = samples1[is][j];

            sum1 += a1;
            sum12 += a1*a1;
            sum01 += a0*a1;
        }
    }

    n *= TSampleMI16::N;

    {
        double nom   = sum01*n - sum0*sum1;
        double den2a = sum02*n - sum0*sum0;
        double den2b = sum12*n - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}